

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Image>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  PlatformInterface *pPVar1;
  long *plVar2;
  VkDeviceSize objectDeviceMemorySize;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  size_t sVar5;
  size_t sVar6;
  char *__s;
  size_t sVar7;
  deUint64 *pdVar8;
  long *plVar9;
  int *piVar10;
  Parameters *in_RCX;
  Parameters *params_00;
  ulong uVar11;
  size_type __n;
  long lVar12;
  bool bVar13;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
  objects;
  AllocationCallbackRecorder allocRecorder;
  Environment local_2a0;
  VkImage local_268;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_260;
  Move<vk::Handle<(vk::HandleType)9>_> local_248;
  Environment local_228;
  Move<vk::Handle<(vk::HandleType)9>_> local_1f0;
  VkMemoryRequirements local_1d0;
  undefined1 local_1b8 [8];
  VkAllocationCallbacks aVStack_1b0 [2];
  ios_base local_140 [272];
  
  local_228.vkp = *(PlatformInterface **)(this + 8);
  local_228.vkd = Context::getDeviceInterface((Context *)this);
  local_228.device = Context::getDevice((Context *)this);
  local_228.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_228.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_228.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_228.maxResourceConsumers = 1;
  Image::create(&local_248,&local_228,(Resources *)&params,in_RCX);
  ::vk::getImageMemoryRequirements
            (&local_1d0,local_228.vkd,local_228.device,
             (VkImage)local_248.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal);
  objectDeviceMemorySize = getPageTableSize((Context *)**(undefined8 **)this,local_1d0.size);
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b8,allocator,0x400);
  pPVar1 = *(PlatformInterface **)(this + 8);
  pDVar3 = Context::getDeviceInterface((Context *)this);
  pVVar4 = Context::getDevice((Context *)this);
  local_2a0.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  params_00 = *(Parameters **)(this + 0x10);
  local_2a0.maxResourceConsumers = 1;
  local_2a0.vkp = pPVar1;
  local_2a0.vkd = pDVar3;
  local_2a0.device = pVVar4;
  local_2a0.programBinaries = (BinaryCollection *)params_00;
  local_2a0.allocationCallbacks = aVStack_1b0;
  sVar5 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b8);
  Image::create(&local_1f0,&local_2a0,(Resources *)&params,params_00);
  DStack_260.m_device =
       local_1f0.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
  DStack_260.m_allocator =
       local_1f0.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  local_268.m_internal =
       local_1f0.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  DStack_260.m_deviceIface =
       local_1f0.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
  sVar6 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_1b8);
  if (local_268.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_260,local_268);
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_1b8);
  sVar5 = getSafeObjectCount((Context *)**(undefined8 **)this,sVar6 - sVar5,objectDeviceMemorySize);
  if (local_248.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&local_248.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)local_248.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  __n = 0x4000;
  if (sVar5 < 0x4000) {
    __n = sVar5;
  }
  local_2a0.vkp = *(PlatformInterface **)(this + 8);
  local_2a0.vkd = Context::getDeviceInterface((Context *)this);
  local_2a0.device = Context::getDevice((Context *)this);
  local_2a0.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_2a0.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_2a0.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_2a0.maxResourceConsumers = (deUint32)__n;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
            *)&local_228,__n,(allocator_type *)local_1b8);
  local_1b8 = *(undefined1 (*) [8])(*(long *)this + 0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)aVStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1b0,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)aVStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1b0," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)9>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)((DeviceInterface *)((long)aVStack_1b0[0].pUserData + -0x18))->
                         _vptr_DeviceInterface + (int)aVStack_1b0);
  }
  else {
    sVar7 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1b0,__s,sVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)aVStack_1b0," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)aVStack_1b0);
  std::ios_base::~ios_base(local_140);
  if (sVar5 != 0) {
    lVar12 = 8;
    uVar11 = 0;
    do {
      pdVar8 = (deUint64 *)operator_new(0x20);
      Image::create((Move<vk::Handle<(vk::HandleType)9>_> *)local_1b8,&local_2a0,
                    (Resources *)&params,params_00);
      pdVar8[2] = (deUint64)aVStack_1b0[0].pfnAllocation;
      pdVar8[3] = (deUint64)aVStack_1b0[0].pfnReallocation;
      *pdVar8 = (deUint64)local_1b8;
      pdVar8[1] = (deUint64)aVStack_1b0[0].pUserData;
      local_1b8 = (undefined1  [8])0x0;
      aVStack_1b0[0].pUserData = (DeviceInterface *)0x0;
      aVStack_1b0[0].pfnAllocation = (PFN_vkAllocationFunction)0x0;
      aVStack_1b0[0].pfnReallocation = (PFN_vkReallocationFunction)0x0;
      plVar9 = (long *)operator_new(0x20);
      pPVar1 = local_228.vkp;
      *(undefined4 *)(plVar9 + 1) = 0;
      *(undefined4 *)((long)plVar9 + 0xc) = 0;
      *plVar9 = (long)&PTR__SharedPtrState_00d24810;
      plVar9[2] = (long)pdVar8;
      *(undefined4 *)(plVar9 + 1) = 1;
      *(undefined4 *)((long)plVar9 + 0xc) = 1;
      plVar2 = *(long **)((long)&(local_228.vkp)->_vptr_PlatformInterface + lVar12);
      if (plVar2 != plVar9) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)((long)local_228.vkp + lVar12 + -8) = 0;
            (**(code **)(**(long **)((long)&(local_228.vkp)->_vptr_PlatformInterface + lVar12) +
                        0x10))();
          }
          LOCK();
          piVar10 = (int *)(*(long *)((long)&pPVar1->_vptr_PlatformInterface + lVar12) + 0xc);
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            plVar2 = *(long **)((long)&pPVar1->_vptr_PlatformInterface + lVar12);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 8))();
            }
            *(undefined8 *)((long)&pPVar1->_vptr_PlatformInterface + lVar12) = 0;
          }
        }
        *(deUint64 **)((long)pPVar1 + lVar12 + -8) = pdVar8;
        *(long **)((long)&pPVar1->_vptr_PlatformInterface + lVar12) = plVar9;
        LOCK();
        *(int *)(plVar9 + 1) = (int)plVar9[1] + 1;
        UNLOCK();
        LOCK();
        piVar10 = (int *)(*(long *)((long)&pPVar1->_vptr_PlatformInterface + lVar12) + 0xc);
        *piVar10 = *piVar10 + 1;
        UNLOCK();
      }
      plVar2 = plVar9 + 1;
      LOCK();
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar9 + 0x10))(plVar9);
      }
      piVar10 = (int *)((long)plVar9 + 0xc);
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        (**(code **)(*plVar9 + 8))(plVar9);
      }
      if (local_1b8 != (undefined1  [8])0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)9>_> *)aVStack_1b0,(VkImage)local_1b8);
      }
      bVar13 = (uVar11 & 0x3ff) != 0;
      params_00 = (Parameters *)CONCAT71((int7)((ulong)params_00 >> 8),bVar13 || uVar11 == 0);
      if (!bVar13 && uVar11 != 0) {
        tcu::TestContext::touchWatchdog(*(TestContext **)this);
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x10;
    } while (__n != uVar11);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
  ::_M_erase_at_end((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
                     *)&local_228,(pointer)local_228.vkp);
  local_1b8 = (undefined1  [8])&aVStack_1b0[0].pfnAllocation;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1b8,
             (undefined1 *)((long)(_func_int ***)aVStack_1b0[0].pUserData + (long)local_1b8));
  if (local_1b8 != (undefined1  [8])&aVStack_1b0[0].pfnAllocation) {
    operator_delete((void *)local_1b8,(ulong)(aVStack_1b0[0].pfnAllocation + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>_>_>_>
             *)&local_228);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}